

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O1

pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>_>_>::iterator,_bool>
* __thiscall
absl::lts_20250127::container_internal::
raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,std::pair<unsigned_long,unsigned_long>>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,std::pair<unsigned_long,unsigned_long>>>>
::find_or_prepare_insert_non_soo<std::__cxx11::string>
          (pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>_>_>::iterator,_bool>
           *__return_storage_ptr__,
          raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,std::pair<unsigned_long,unsigned_long>>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,std::pair<unsigned_long,unsigned_long>>>>
          *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *key)

{
  char *pcVar1;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  uint uVar5;
  ushort uVar6;
  char cVar7;
  char cVar8;
  char cVar9;
  char cVar10;
  char cVar11;
  char cVar12;
  char cVar13;
  char cVar14;
  char cVar15;
  char cVar16;
  char cVar17;
  char cVar18;
  char cVar19;
  char cVar20;
  char cVar21;
  char cVar22;
  char cVar23;
  char cVar24;
  char cVar25;
  char cVar26;
  char cVar27;
  char cVar28;
  char cVar29;
  char cVar30;
  char cVar31;
  char cVar32;
  char cVar33;
  char cVar34;
  char cVar35;
  char cVar36;
  char cVar37;
  char cVar38;
  undefined1 uVar39;
  bool bVar40;
  ushort uVar41;
  uint64_t uVar42;
  size_t sVar43;
  ulong uVar44;
  ctrl_t *pcVar45;
  ulong uVar46;
  bool bVar47;
  slot_type *policy;
  slot_type *psVar48;
  uint uVar49;
  ulong uVar50;
  CommonFields *common;
  long lVar51;
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  FindInfo target;
  __m128i match;
  EqualElement<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_78;
  pair<std::tuple<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_std::tuple<const_std::pair<unsigned_long,_unsigned_long>_&>_>
  local_68;
  undefined1 local_58 [16];
  char local_48;
  char cStack_47;
  char cStack_46;
  char cStack_45;
  char cStack_44;
  char cStack_43;
  char cStack_42;
  char cStack_41;
  char cStack_40;
  char cStack_3f;
  char cStack_3e;
  char cStack_3d;
  char cStack_3c;
  char cStack_3b;
  char cStack_3a;
  char cStack_39;
  
  uVar2 = key->_M_string_length;
  uVar42 = hash_internal::MixingHashState::CombineContiguousImpl
                     (&hash_internal::MixingHashState::kSeed,(key->_M_dataplus)._M_p,uVar2);
  uVar3 = *(ulong *)this;
  if ((uVar3 + 1 & uVar3) != 0) {
    __assert_fail("(((mask + 1) & mask) == 0 && \"not a mask\") && \"Try enabling sanitizers.\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0x14c,
                  "absl::container_internal::probe_seq<16>::probe_seq(size_t, size_t) [Width = 16]")
    ;
  }
  uVar50 = (uVar42 ^ uVar2) * -0x234dd359734ecb13;
  common = (CommonFields *)
           (uVar50 >> 0x38 | (uVar50 & 0xff000000000000) >> 0x28 | (uVar50 & 0xff0000000000) >> 0x18
            | (uVar50 & 0xff00000000) >> 8 | (uVar50 & 0xff000000) << 8 |
            (uVar50 & 0xff0000) << 0x18 | (uVar50 & 0xff00) << 0x28 | uVar50 << 0x38);
  uVar2 = *(ulong *)(this + 0x10);
  uVar44 = ((ulong)common >> 7 ^ uVar2 >> 0xc) & uVar3;
  uVar39 = (undefined1)(uVar50 >> 0x38);
  auVar52 = ZEXT216(CONCAT11(uVar39,uVar39) & 0x7f7f);
  auVar52 = pshuflw(auVar52,auVar52,0);
  local_58._0_4_ = auVar52._0_4_;
  local_58._4_4_ = local_58._0_4_;
  local_58._8_4_ = local_58._0_4_;
  local_58._12_4_ = local_58._0_4_;
  pcVar45 = (__return_storage_ptr__->first).ctrl_;
  psVar48 = (__return_storage_ptr__->first).field_1.slot_;
  bVar47 = __return_storage_ptr__->second;
  uVar50 = 0;
  do {
    pcVar1 = (char *)(uVar2 + uVar44);
    auVar52[0] = -(local_58[0] == *pcVar1);
    auVar52[1] = -(local_58[1] == pcVar1[1]);
    auVar52[2] = -(local_58[2] == pcVar1[2]);
    auVar52[3] = -(local_58[3] == pcVar1[3]);
    auVar52[4] = -(local_58[4] == pcVar1[4]);
    auVar52[5] = -(local_58[5] == pcVar1[5]);
    auVar52[6] = -(local_58[6] == pcVar1[6]);
    auVar52[7] = -(local_58[7] == pcVar1[7]);
    auVar52[8] = -(local_58[8] == pcVar1[8]);
    auVar52[9] = -(local_58[9] == pcVar1[9]);
    auVar52[10] = -(local_58[10] == pcVar1[10]);
    auVar52[0xb] = -(local_58[0xb] == pcVar1[0xb]);
    auVar52[0xc] = -(local_58[0xc] == pcVar1[0xc]);
    auVar52[0xd] = -(local_58[0xd] == pcVar1[0xd]);
    auVar52[0xe] = -(local_58[0xe] == pcVar1[0xe]);
    auVar52[0xf] = -(local_58[0xf] == pcVar1[0xf]);
    uVar41 = (ushort)(SUB161(auVar52 >> 7,0) & 1) | (ushort)(SUB161(auVar52 >> 0xf,0) & 1) << 1 |
             (ushort)(SUB161(auVar52 >> 0x17,0) & 1) << 2 |
             (ushort)(SUB161(auVar52 >> 0x1f,0) & 1) << 3 |
             (ushort)(SUB161(auVar52 >> 0x27,0) & 1) << 4 |
             (ushort)(SUB161(auVar52 >> 0x2f,0) & 1) << 5 |
             (ushort)(SUB161(auVar52 >> 0x37,0) & 1) << 6 |
             (ushort)(SUB161(auVar52 >> 0x3f,0) & 1) << 7 |
             (ushort)(SUB161(auVar52 >> 0x47,0) & 1) << 8 |
             (ushort)(SUB161(auVar52 >> 0x4f,0) & 1) << 9 |
             (ushort)(SUB161(auVar52 >> 0x57,0) & 1) << 10 |
             (ushort)(SUB161(auVar52 >> 0x5f,0) & 1) << 0xb |
             (ushort)(SUB161(auVar52 >> 0x67,0) & 1) << 0xc |
             (ushort)(SUB161(auVar52 >> 0x6f,0) & 1) << 0xd |
             (ushort)(SUB161(auVar52 >> 0x77,0) & 1) << 0xe | (ushort)(auVar52[0xf] >> 7) << 0xf;
    uVar49 = (uint)uVar41;
    cVar23 = *pcVar1;
    cVar24 = pcVar1[1];
    cVar25 = pcVar1[2];
    cVar26 = pcVar1[3];
    cVar27 = pcVar1[4];
    cVar28 = pcVar1[5];
    cVar29 = pcVar1[6];
    cVar30 = pcVar1[7];
    cVar31 = pcVar1[8];
    cVar32 = pcVar1[9];
    cVar33 = pcVar1[10];
    cVar34 = pcVar1[0xb];
    cVar35 = pcVar1[0xc];
    cVar36 = pcVar1[0xd];
    cVar37 = pcVar1[0xe];
    cVar38 = pcVar1[0xf];
    cVar7 = local_48;
    cVar8 = cStack_47;
    cVar9 = cStack_46;
    cVar10 = cStack_45;
    cVar11 = cStack_44;
    cVar12 = cStack_43;
    cVar13 = cStack_42;
    cVar14 = cStack_41;
    cVar15 = cStack_40;
    cVar16 = cStack_3f;
    cVar17 = cStack_3e;
    cVar18 = cStack_3d;
    cVar19 = cStack_3c;
    cVar20 = cStack_3b;
    cVar21 = cStack_3a;
    cVar22 = cStack_39;
    while (cStack_39 = cVar38, cStack_3a = cVar37, cStack_3b = cVar36, cStack_3c = cVar35,
          cStack_3d = cVar34, cStack_3e = cVar33, cStack_3f = cVar32, cStack_40 = cVar31,
          cStack_41 = cVar30, cStack_42 = cVar29, cStack_43 = cVar28, cStack_44 = cVar27,
          cStack_45 = cVar26, cStack_46 = cVar25, cStack_47 = cVar24, local_48 = cVar23, uVar41 != 0
          ) {
      uVar5 = 0;
      if (uVar49 != 0) {
        for (; (uVar49 >> uVar5 & 1) == 0; uVar5 = uVar5 + 1) {
        }
      }
      uVar46 = uVar5 + uVar44 & uVar3;
      lVar51 = uVar46 * 0x30;
      local_68.second.super__Tuple_impl<0UL,_const_std::pair<unsigned_long,_unsigned_long>_&>.
      super__Head_base<0UL,_const_std::pair<unsigned_long,_unsigned_long>_&,_false>._M_head_impl =
           (_Tuple_impl<0UL,_const_std::pair<unsigned_long,_unsigned_long>_&>)
           (*(long *)(this + 0x18) + lVar51 + 0x20);
      local_68.first.
      super__Tuple_impl<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
      .
      super__Head_base<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_false>
      ._M_head_impl =
           (_Tuple_impl<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
            )(*(long *)(this + 0x18) + lVar51);
      local_78.rhs = key;
      local_78.eq = (key_equal *)this;
      bVar40 = memory_internal::
               DecomposePairImpl<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,std::pair<unsigned_long,unsigned_long>>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,std::pair<unsigned_long,unsigned_long>>>>::EqualElement<std::__cxx11::string>,std::__cxx11::string_const&,std::tuple<std::pair<unsigned_long,unsigned_long>const&>>
                         (&local_78,&local_68);
      if (bVar40) {
        (__return_storage_ptr__->first).field_1.slot_ = psVar48;
        __return_storage_ptr__->second = bVar47;
        (__return_storage_ptr__->first).ctrl_ = pcVar45;
        if (*(long *)(this + 0x10) != 0) {
          lVar4 = *(long *)(this + 0x18);
          (__return_storage_ptr__->first).ctrl_ = (ctrl_t *)(*(long *)(this + 0x10) + uVar46);
          (__return_storage_ptr__->first).field_1.slot_ = (slot_type *)(lVar51 + lVar4);
          __return_storage_ptr__->second = false;
          return __return_storage_ptr__;
        }
        goto LAB_004643d6;
      }
      uVar41 = (ushort)(uVar49 - 1) & (ushort)uVar49;
      uVar49 = CONCAT22((short)(uVar49 - 1 >> 0x10),uVar41);
      cVar23 = local_48;
      cVar24 = cStack_47;
      cVar25 = cStack_46;
      cVar26 = cStack_45;
      cVar27 = cStack_44;
      cVar28 = cStack_43;
      cVar29 = cStack_42;
      cVar30 = cStack_41;
      cVar31 = cStack_40;
      cVar32 = cStack_3f;
      cVar33 = cStack_3e;
      cVar34 = cStack_3d;
      cVar35 = cStack_3c;
      cVar36 = cStack_3b;
      cVar37 = cStack_3a;
      cVar38 = cStack_39;
      cVar7 = local_48;
      cVar8 = cStack_47;
      cVar9 = cStack_46;
      cVar10 = cStack_45;
      cVar11 = cStack_44;
      cVar12 = cStack_43;
      cVar13 = cStack_42;
      cVar14 = cStack_41;
      cVar15 = cStack_40;
      cVar16 = cStack_3f;
      cVar17 = cStack_3e;
      cVar18 = cStack_3d;
      cVar19 = cStack_3c;
      cVar20 = cStack_3b;
      cVar21 = cStack_3a;
      cVar22 = cStack_39;
    }
    auVar53[0] = -(local_48 == -0x80);
    auVar53[1] = -(cStack_47 == -0x80);
    auVar53[2] = -(cStack_46 == -0x80);
    auVar53[3] = -(cStack_45 == -0x80);
    auVar53[4] = -(cStack_44 == -0x80);
    auVar53[5] = -(cStack_43 == -0x80);
    auVar53[6] = -(cStack_42 == -0x80);
    auVar53[7] = -(cStack_41 == -0x80);
    auVar53[8] = -(cStack_40 == -0x80);
    auVar53[9] = -(cStack_3f == -0x80);
    auVar53[10] = -(cStack_3e == -0x80);
    auVar53[0xb] = -(cStack_3d == -0x80);
    auVar53[0xc] = -(cStack_3c == -0x80);
    auVar53[0xd] = -(cStack_3b == -0x80);
    auVar53[0xe] = -(cStack_3a == -0x80);
    auVar53[0xf] = -(cStack_39 == -0x80);
    uVar41 = (ushort)(SUB161(auVar53 >> 7,0) & 1) | (ushort)(SUB161(auVar53 >> 0xf,0) & 1) << 1 |
             (ushort)(SUB161(auVar53 >> 0x17,0) & 1) << 2 |
             (ushort)(SUB161(auVar53 >> 0x1f,0) & 1) << 3 |
             (ushort)(SUB161(auVar53 >> 0x27,0) & 1) << 4 |
             (ushort)(SUB161(auVar53 >> 0x2f,0) & 1) << 5 |
             (ushort)(SUB161(auVar53 >> 0x37,0) & 1) << 6 |
             (ushort)(SUB161(auVar53 >> 0x3f,0) & 1) << 7 |
             (ushort)(SUB161(auVar53 >> 0x47,0) & 1) << 8 |
             (ushort)(SUB161(auVar53 >> 0x4f,0) & 1) << 9 |
             (ushort)(SUB161(auVar53 >> 0x57,0) & 1) << 10 |
             (ushort)(SUB161(auVar53 >> 0x5f,0) & 1) << 0xb |
             (ushort)(SUB161(auVar53 >> 0x67,0) & 1) << 0xc |
             (ushort)(SUB161(auVar53 >> 0x6f,0) & 1) << 0xd |
             (ushort)(SUB161(auVar53 >> 0x77,0) & 1) << 0xe | (ushort)(auVar53[0xf] >> 7) << 0xf;
    local_48 = cVar7;
    cStack_47 = cVar8;
    cStack_46 = cVar9;
    cStack_45 = cVar10;
    cStack_44 = cVar11;
    cStack_43 = cVar12;
    cStack_42 = cVar13;
    cStack_41 = cVar14;
    cStack_40 = cVar15;
    cStack_3f = cVar16;
    cStack_3e = cVar17;
    cStack_3d = cVar18;
    cStack_3c = cVar19;
    cStack_3b = cVar20;
    cStack_3a = cVar21;
    cStack_39 = cVar22;
    if (uVar41 == 0) {
      uVar46 = uVar50 + 0x10;
      if (*(ulong *)this < uVar46) {
        (__return_storage_ptr__->first).field_1.slot_ = psVar48;
        __return_storage_ptr__->second = bVar47;
        (__return_storage_ptr__->first).ctrl_ = pcVar45;
        __assert_fail("(seq.index() <= capacity() && \"full table!\") && \"Try enabling sanitizers.\""
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                      ,0xf7d,
                      "std::pair<iterator, bool> absl::container_internal::raw_hash_set<absl::container_internal::FlatHashMapPolicy<std::basic_string<char>, std::pair<unsigned long, unsigned long>>, absl::container_internal::StringHash, absl::container_internal::StringEq, std::allocator<std::pair<const std::basic_string<char>, std::pair<unsigned long, unsigned long>>>>::find_or_prepare_insert_non_soo(const K &) [Policy = absl::container_internal::FlatHashMapPolicy<std::basic_string<char>, std::pair<unsigned long, unsigned long>>, Hash = absl::container_internal::StringHash, Eq = absl::container_internal::StringEq, Alloc = std::allocator<std::pair<const std::basic_string<char>, std::pair<unsigned long, unsigned long>>>, K = std::basic_string<char>]"
                     );
      }
      uVar44 = uVar44 + uVar50 + 0x10 & uVar3;
    }
    else {
      policy = psVar48;
      bVar40 = ShouldInsertBackwardsForDebug
                         (*(size_t *)this,(size_t)common,*(ctrl_t **)(this + 0x10));
      if (bVar40) {
        uVar6 = 0xf;
        if (uVar41 != 0) {
          for (; uVar41 >> uVar6 == 0; uVar6 = uVar6 - 1) {
          }
        }
        uVar49 = (ushort)((uVar6 ^ 0xfff0) + 0x11) - 1;
      }
      else {
        uVar49 = 0;
        if (uVar41 != 0) {
          for (; (uVar41 >> uVar49 & 1) == 0; uVar49 = uVar49 + 1) {
          }
        }
      }
      target.probe_length = (size_t)GetPolicyFunctions()::value;
      target.offset = uVar50;
      sVar43 = PrepareInsertNonSoo((container_internal *)this,common,uVar49 + uVar44 & uVar3,target,
                                   (PolicyFunctions *)&policy->value);
      if (*(long *)(this + 0x10) == 0) {
        (__return_storage_ptr__->first).field_1.slot_ = psVar48;
        __return_storage_ptr__->second = bVar47;
        (__return_storage_ptr__->first).ctrl_ = pcVar45;
LAB_004643d6:
        __assert_fail("ctrl != nullptr",
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                      ,0x9ef,
                      "absl::container_internal::raw_hash_set<absl::container_internal::FlatHashMapPolicy<std::basic_string<char>, std::pair<unsigned long, unsigned long>>, absl::container_internal::StringHash, absl::container_internal::StringEq, std::allocator<std::pair<const std::basic_string<char>, std::pair<unsigned long, unsigned long>>>>::iterator::iterator(ctrl_t *, slot_type *, const GenerationType *) [Policy = absl::container_internal::FlatHashMapPolicy<std::basic_string<char>, std::pair<unsigned long, unsigned long>>, Hash = absl::container_internal::StringHash, Eq = absl::container_internal::StringEq, Alloc = std::allocator<std::pair<const std::basic_string<char>, std::pair<unsigned long, unsigned long>>>]"
                     );
      }
      pcVar45 = (ctrl_t *)(*(long *)(this + 0x10) + sVar43);
      psVar48 = (slot_type *)(sVar43 * 0x30 + *(long *)(this + 0x18));
      bVar47 = true;
      uVar46 = uVar50;
    }
    uVar50 = uVar46;
    if (uVar41 != 0) {
      (__return_storage_ptr__->first).field_1.slot_ = psVar48;
      __return_storage_ptr__->second = bVar47;
      (__return_storage_ptr__->first).ctrl_ = pcVar45;
      return __return_storage_ptr__;
    }
  } while( true );
}

Assistant:

std::pair<iterator, bool> find_or_prepare_insert_non_soo(const K& key) {
    ABSL_SWISSTABLE_ASSERT(!is_soo());
    prefetch_heap_block();
    auto hash = hash_ref()(key);
    auto seq = probe(common(), hash);
    const ctrl_t* ctrl = control();
    while (true) {
      Group g{ctrl + seq.offset()};
      for (uint32_t i : g.Match(H2(hash))) {
        if (ABSL_PREDICT_TRUE(PolicyTraits::apply(
                EqualElement<K>{key, eq_ref()},
                PolicyTraits::element(slot_array() + seq.offset(i)))))
          return {iterator_at(seq.offset(i)), false};
      }
      auto mask_empty = g.MaskEmpty();
      if (ABSL_PREDICT_TRUE(mask_empty)) {
        size_t target = seq.offset(
            GetInsertionOffset(mask_empty, capacity(), hash, control()));
        return {iterator_at(PrepareInsertNonSoo(common(), hash,
                                                FindInfo{target, seq.index()},
                                                GetPolicyFunctions())),
                true};
      }
      seq.next();
      ABSL_SWISSTABLE_ASSERT(seq.index() <= capacity() && "full table!");
    }
  }